

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

int __thiscall
flow::AllocaInstr::clone
          (AllocaInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LiteralType ty;
  Value *n;
  AllocaInstr *this_00;
  
  ty = *(LiteralType *)(__fn + 8);
  n = (Value *)**(undefined8 **)(__fn + 0x50);
  this_00 = (AllocaInstr *)operator_new(0x68);
  AllocaInstr(this_00,ty,n,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> AllocaInstr::clone() {
  return std::make_unique<AllocaInstr>(type(), operand(0), name());
}